

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O0

void __thiscall CompilerStatistics::~CompilerStatistics(CompilerStatistics *this)

{
  CompilerStatistics *this_local;
  
  SmallArray<CompilerStatistics::Timer,_16U>::~SmallArray(&this->timers);
  return;
}

Assistant:

CompilerStatistics()
	{
		startTime = 0;
		finishTime = 0;

		timers.push_back(Timer("Lexer", "lexer"));
		timers.push_back(Timer("Parse", "parse"));

		timers.push_back(Timer("Import", "import"));
		timers.push_back(Timer("Expressions", "analyze"));
		timers.push_back(Timer("Finalization", "(finalize)"));
		timers.push_back(Timer("Cleanup", "(cleanup)"));

		timers.push_back(Timer("IrCodeGen", "codegen"));
		timers.push_back(Timer("LlvmCodeGen", "llvm"));
		timers.push_back(Timer("IrOptimization", "optimization"));
		timers.push_back(Timer("IrFinalization", "(finalize)"));
		timers.push_back(Timer("IrLowering", "lower"));
		timers.push_back(Timer("Bytecode", "bytecode"));
		timers.push_back(Timer("BytecodeCache", "(cache)"));

		timers.push_back(Timer("Logging", "logs"));
		timers.push_back(Timer("Tracing", "trace"));
		timers.push_back(Timer("Extra", "extra"));
	}